

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O3

void pbrt::VolPathIntegrator::rescale
               (SampledSpectrum *beta,SampledSpectrum *pdfLight,SampledSpectrum *pdfUni)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int i;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Float m;
  undefined1 auVar10 [16];
  Float m_1;
  undefined1 auVar12 [64];
  Float m_2;
  undefined1 auVar13 [64];
  undefined1 auVar11 [64];
  
  fVar6 = (beta->values).values[0];
  auVar11 = ZEXT464((uint)fVar6);
  lVar5 = 1;
  auVar10 = ZEXT416((uint)fVar6);
  do {
    pfVar1 = (beta->values).values + lVar5;
    lVar5 = lVar5 + 1;
    auVar10 = vmaxss_avx(ZEXT416((uint)*pfVar1),auVar10);
  } while (lVar5 != 4);
  fVar9 = 5.9604645e-08;
  fVar6 = 5.9604645e-08;
  fVar7 = 5.9604645e-08;
  fVar8 = 5.9604645e-08;
  if (auVar10._0_4_ <= 16777216.0) {
    fVar2 = (pdfLight->values).values[0];
    auVar12 = ZEXT464((uint)fVar2);
    lVar5 = 1;
    auVar10 = ZEXT416((uint)fVar2);
    do {
      pfVar1 = (pdfLight->values).values + lVar5;
      lVar5 = lVar5 + 1;
      auVar10 = vmaxss_avx(ZEXT416((uint)*pfVar1),auVar10);
    } while (lVar5 != 4);
    if (auVar10._0_4_ <= 16777216.0) {
      fVar2 = (pdfUni->values).values[0];
      auVar13 = ZEXT464((uint)fVar2);
      lVar5 = 1;
      auVar10 = ZEXT416((uint)fVar2);
      do {
        pfVar1 = (pdfUni->values).values + lVar5;
        lVar5 = lVar5 + 1;
        auVar10 = vmaxss_avx(ZEXT416((uint)*pfVar1),auVar10);
      } while (lVar5 != 4);
      if (auVar10._0_4_ <= 16777216.0) {
        lVar5 = 1;
        do {
          pfVar1 = (beta->values).values + lVar5;
          lVar5 = lVar5 + 1;
          auVar10 = vmaxss_avx(ZEXT416((uint)*pfVar1),auVar11._0_16_);
          auVar11 = ZEXT1664(auVar10);
        } while (lVar5 != 4);
        fVar9 = 16777216.0;
        fVar6 = 16777216.0;
        fVar7 = 16777216.0;
        fVar8 = 16777216.0;
        if (5.9604645e-08 <= auVar10._0_4_) {
          lVar5 = 1;
          do {
            pfVar1 = (pdfLight->values).values + lVar5;
            lVar5 = lVar5 + 1;
            auVar10 = vmaxss_avx(ZEXT416((uint)*pfVar1),auVar12._0_16_);
            auVar12 = ZEXT1664(auVar10);
          } while (lVar5 != 4);
          if (5.9604645e-08 <= auVar10._0_4_) {
            lVar5 = 1;
            do {
              pfVar1 = (pdfUni->values).values + lVar5;
              lVar5 = lVar5 + 1;
              auVar10 = vmaxss_avx(ZEXT416((uint)*pfVar1),auVar13._0_16_);
              auVar13 = ZEXT1664(auVar10);
            } while (lVar5 != 4);
            if (5.9604645e-08 <= auVar10._0_4_) {
              return;
            }
          }
        }
      }
    }
  }
  fVar2 = (beta->values).values[1];
  fVar3 = (beta->values).values[2];
  fVar4 = (beta->values).values[3];
  (beta->values).values[0] = fVar6 * (beta->values).values[0];
  (beta->values).values[1] = fVar7 * fVar2;
  (beta->values).values[2] = fVar8 * fVar3;
  (beta->values).values[3] = fVar9 * fVar4;
  fVar2 = (pdfLight->values).values[1];
  fVar3 = (pdfLight->values).values[2];
  fVar4 = (pdfLight->values).values[3];
  (pdfLight->values).values[0] = fVar6 * (pdfLight->values).values[0];
  (pdfLight->values).values[1] = fVar7 * fVar2;
  (pdfLight->values).values[2] = fVar8 * fVar3;
  (pdfLight->values).values[3] = fVar9 * fVar4;
  fVar2 = (pdfUni->values).values[1];
  fVar3 = (pdfUni->values).values[2];
  fVar4 = (pdfUni->values).values[3];
  (pdfUni->values).values[0] = fVar6 * (pdfUni->values).values[0];
  (pdfUni->values).values[1] = fVar7 * fVar2;
  (pdfUni->values).values[2] = fVar8 * fVar3;
  (pdfUni->values).values[3] = fVar9 * fVar4;
  return;
}

Assistant:

PBRT_CPU_GPU
    Float MaxComponentValue() const {
        Float m = values[0];
        for (int i = 1; i < NSpectrumSamples; ++i)
            m = std::max(m, values[i]);
        return m;
    }